

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

PropertyBase *
Protocol::MQTT::V5::
TypedProperty<(Protocol::MQTT::V5::PropertyType)38,_Protocol::MQTT::Common::DynamicStringPair>::
allocateProp(void)

{
  PropertyBase *pPVar1;
  DynamicStringPair local_58;
  
  pPVar1 = (PropertyBase *)operator_new(0x48);
  local_58.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00127418;
  local_58.key.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00127178;
  local_58.key.length = 0;
  local_58.key.data = (char *)malloc(0);
  local_58.value.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00127178;
  local_58.value.length = 0;
  local_58.value.data = (char *)malloc(0);
  pPVar1->type = '&';
  pPVar1->next = (PropertyBase *)0x0;
  pPVar1->heapAllocated = true;
  (pPVar1->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_getSize_00127468;
  Common::DynamicStringPair::DynamicStringPair((DynamicStringPair *)&pPVar1->field_0x19,&local_58);
  free(local_58.value.data);
  local_58.value.length = 0;
  free(local_58.key.data);
  return pPVar1;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }